

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O2

Vec_Ptr_t * Abc_AigGetLevelizedOrder(Abc_Ntk_t *pNtk,int fCollectCis)

{
  int iVar1;
  void **ppvVar2;
  int iVar3;
  Vec_Ptr_t *p;
  Abc_Obj_t *pAVar4;
  Vec_Ptr_t *p_00;
  void *Entry;
  uint i;
  
  if (pNtk->ntkType == ABC_NTK_STRASH) {
    Abc_NtkCleanCopy(pNtk);
    iVar3 = Abc_AigSetChoiceLevels(pNtk);
    p = Vec_PtrStart(iVar3 + 1);
    for (iVar3 = 0; iVar3 < pNtk->vObjs->nSize; iVar3 = iVar3 + 1) {
      pAVar4 = Abc_NtkObj(pNtk,iVar3);
      if ((pAVar4 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar4->field_0x14 & 0xf) == 7)) {
        ppvVar2 = p->pArray;
        iVar1 = (pAVar4->field_6).iTemp;
        pAVar4->field_6 = *(anon_union_8_4_617c9805_for_Abc_Obj_t__17 *)(ppvVar2 + iVar1);
        ppvVar2[iVar1] = pAVar4;
      }
    }
    p_00 = Vec_PtrStart(pNtk->nObjCounts[7]);
    iVar3 = p->nSize;
    for (i = (uint)(fCollectCis == 0); (int)i < iVar3; i = i + 1) {
      for (Entry = Vec_PtrEntry(p,i); Entry != (void *)0x0; Entry = *(void **)((long)Entry + 0x40))
      {
        Vec_PtrPush(p_00,Entry);
      }
    }
    Vec_PtrFree(p);
    return p_00;
  }
  __assert_fail("Abc_NtkIsStrash(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcDfs.c"
                ,0x72e,"Vec_Ptr_t *Abc_AigGetLevelizedOrder(Abc_Ntk_t *, int)");
}

Assistant:

Vec_Ptr_t * Abc_AigGetLevelizedOrder( Abc_Ntk_t * pNtk, int fCollectCis )
{
    Vec_Ptr_t * vNodes, * vLevels;
    Abc_Obj_t * pNode, ** ppHead;
    int LevelMax, i;
    assert( Abc_NtkIsStrash(pNtk) );
    // set the correct levels
    Abc_NtkCleanCopy( pNtk );
    LevelMax = Abc_AigSetChoiceLevels( pNtk );
    // relink nodes by level
    vLevels = Vec_PtrStart( LevelMax + 1 );
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        ppHead = ((Abc_Obj_t **)vLevels->pArray) + (int)(ABC_PTRINT_T)pNode->pCopy;
        pNode->pCopy = *ppHead;
        *ppHead = pNode;
    }
    // recollect nodes
    vNodes = Vec_PtrStart( Abc_NtkNodeNum(pNtk) );
    Vec_PtrForEachEntryStart( Abc_Obj_t *, vLevels, pNode, i, !fCollectCis )
        for ( ; pNode; pNode = pNode->pCopy )
            Vec_PtrPush( vNodes, pNode );
    Vec_PtrFree( vLevels );
    return vNodes;
}